

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O1

void __thiscall soul::StructuralParser::throwError(StructuralParser *this,CompileMessage *message)

{
  pointer pcVar1;
  Context local_60;
  CompileMessage local_48;
  
  local_60.location.sourceCode.object = (this->super_SOULTokeniser).location.sourceCode.object;
  if (local_60.location.sourceCode.object != (SourceCodeText *)0x0) {
    ((local_60.location.sourceCode.object)->super_RefCountedObject).refCount =
         ((local_60.location.sourceCode.object)->super_RefCountedObject).refCount + 1;
  }
  local_60.location.location.data = (this->super_SOULTokeniser).location.location.data;
  local_60.parentScope = this->currentScope;
  local_48.description._M_dataplus._M_p = (pointer)&local_48.description.field_2;
  pcVar1 = (message->description)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + (message->description)._M_string_length);
  local_48.location.sourceCode.object = (message->location).sourceCode.object;
  if (local_48.location.sourceCode.object != (SourceCodeText *)0x0) {
    ((local_48.location.sourceCode.object)->super_RefCountedObject).refCount =
         ((local_48.location.sourceCode.object)->super_RefCountedObject).refCount + 1;
  }
  local_48.location.location.data = (message->location).location.data;
  local_48.type = message->type;
  local_48.category = message->category;
  AST::Context::throwError(&local_60,&local_48,false);
}

Assistant:

[[noreturn]] void throwError (const CompileMessage& message) const override
    {
        getContext().throwError (message);
    }